

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

ptr<req_msg> __thiscall
nuraft::raft_server::create_sync_snapshot_req
          (raft_server *this,ptr<peer> *pp,ulong last_log_idx,ulong term,ulong commit_idx,
          bool *succeeded_out)

{
  undefined4 uVar1;
  peer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _func_int **pp_Var3;
  element_type *peVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 this_01;
  bool bVar7;
  int iVar8;
  int32 iVar9;
  uint uVar10;
  snapshot_io_mgr *this_02;
  size_t sVar11;
  snapshot_sync_req *this_03;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  undefined8 *puVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  ulong size;
  _func_int **pp_Var16;
  element_type eVar17;
  long lVar18;
  ptr<req_msg> pVar19;
  undefined1 *in_stack_00000008;
  bool last_request;
  unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_> sync_req;
  ptr<req_msg> *req;
  unique_lock<std::mutex> guard;
  ptr<raft_params> params;
  bool local_139;
  undefined1 local_138 [32];
  __shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 local_108 [32];
  __shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2> local_e8 [2];
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  ptr<snapshot_sync_ctx> local_a0;
  undefined8 local_90;
  undefined1 local_88 [16];
  ptr<raft_server> local_78;
  undefined1 local_68 [16];
  __native_type local_58;
  
  *in_stack_00000008 = 0;
  this_00 = *(peer **)last_log_idx;
  local_e8[1]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  local_c8._0_8_ = commit_idx;
  local_90 = succeeded_out;
  context::get_params((context *)&local_58.__data);
  local_68._0_8_ = &this_00->lock_;
  local_68[8] = false;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  peer::get_snapshot_sync_ctx((peer *)local_108);
  local_118._M_ptr = (element_type *)0x0;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((element_type *)local_108._0_8_ == (element_type *)0x0) {
    eVar17._vptr_rpc_listener = (_func_int **)0x0;
  }
  else {
    local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._M_ptr = (element_type *)(((string *)(local_108._0_8_ + 8))->_M_dataplus)._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_118._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108._0_8_ + 0x10));
    p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
      if (4 < iVar8) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_138,
                   "previous sync_ctx exists %p, offset %lu, snp idx %lu, user_ctx %p",
                   local_108._0_8_,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_108._0_8_ + 0x18))->_M_allocated_capacity,
                   (local_118._M_ptr)->_vptr_rpc_listener,*(undefined8 *)(local_108._0_8_ + 0x20));
        (*p_Var2->_vptr__Sp_counted_base[8])
                  (p_Var2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x5c,local_138);
        if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
      }
    }
    eVar17._vptr_rpc_listener = (local_118._M_ptr)->_vptr_rpc_listener;
    bVar7 = timer_helper::timeout((timer_helper *)(local_108._0_8_ + 0x28));
    if (bVar7) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
        if (3 < iVar8) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,"previous sync_ctx %p timed out, reset it",local_108._0_8_)
          ;
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x60,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      local_a0.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_108._0_8_;
      local_a0.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_108._8_8_ + 8) = *(_Atomic_word *)(local_108._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_108._8_8_ + 8) = *(_Atomic_word *)(local_108._8_8_ + 8) + 1;
        }
      }
      destroy_user_snp_ctx((raft_server *)pp,&local_a0);
      if (local_a0.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.
                   super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar5 = local_108._8_8_;
      local_108._0_8_ = (element_type *)0x0;
      local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
      }
      _Var15._M_pi = local_118._M_refcount._M_pi;
      local_118._M_ptr = (element_type *)0x0;
      local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
      }
    }
  }
  if ((local_118._M_ptr == (element_type *)0x0) ||
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_108._0_8_ + 0x18))->_M_allocated_capacity == 0)) {
    get_last_snapshot((raft_server *)local_138);
    uVar6 = local_138._8_8_;
    uVar5 = local_138._0_8_;
    local_138._0_8_ = (element_type *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    _Var15._M_pi = local_118._M_refcount._M_pi;
    local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    local_118._M_ptr = (element_type *)uVar5;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    if ((local_118._M_ptr == (element_type *)0x0) || ((local_118._M_ptr)->_vptr_rpc_listener < term)
       ) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
        if (1 < iVar8) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,
                     "system is running into fatal errors, failed to find a snapshot for peer %d (snapshot null: %d, snapshot doesn\'t contais lastLogIndex: %d)"
                     ,(ulong)(uint)((this_00->config_).
                                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->id_,(ulong)(local_118._M_ptr == (element_type *)0x0),
                     (ulong)((local_118._M_ptr)->_vptr_rpc_listener < term));
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x78,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      if ((local_118._M_ptr != (element_type *)0x0) &&
         (p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi, p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
        if (1 < iVar8) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,"last log idx %lu, snp last log idx %lu",term,
                     (local_118._M_ptr)->_vptr_rpc_listener);
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x7b,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      pp_Var16 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
      (**(code **)(*pp_Var16 + 0x40))(pp_Var16,0xfffffff0);
      goto LAB_00226e8d;
    }
    if ((*(char *)&((element_type *)((long)local_118._M_ptr + 0x28))->_vptr_rpc_listener == '\x01')
       && (((element_type *)((long)local_118._M_ptr + 0x10))->_vptr_rpc_listener ==
           (_func_int **)0x0)) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
        if (1 < iVar8) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,
                     "invalid snapshot, this usually means a bug from state machine implementation, stop the system to prevent further errors"
                    );
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x88,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      pp_Var16 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
      (**(code **)(*pp_Var16 + 0x40))(pp_Var16,0xffffffef);
      goto LAB_00226e8d;
    }
    if (((local_118._M_ptr)->_vptr_rpc_listener != eVar17._vptr_rpc_listener) &&
       (p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi, p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
      if (3 < iVar8) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_138,
                   "trying to sync snapshot with last index %lu to peer %d, its last log idx %lu",
                   (local_118._M_ptr)->_vptr_rpc_listener,
                   (ulong)(uint)((this_00->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_,term);
        (*p_Var2->_vptr__Sp_counted_base[8])
                  (p_Var2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x92,local_138);
        if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
      }
    }
    if ((element_type *)local_108._0_8_ != (element_type *)0x0) {
      local_b0._0_8_ = local_108._0_8_;
      local_b0._8_8_ = local_108._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_108._8_8_ + 8) = *(_Atomic_word *)(local_108._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_108._8_8_ + 8) = *(_Atomic_word *)(local_108._8_8_ + 8) + 1;
        }
      }
      destroy_user_snp_ctx((raft_server *)pp,(ptr<snapshot_sync_ctx> *)local_b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
      }
    }
    context::get_params((context *)local_138);
    iVar8 = *(int *)&(((string *)(local_138._0_8_ + 8))->_M_dataplus)._M_p;
    lVar18 = (long)DAT_0063ca08;
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    peer::set_snapshot_in_sync(this_00,(ptr<snapshot> *)&local_118,lVar18 * iVar8);
  }
  if (*(char *)(local_58.__align + 100) == '\x01') {
    this_02 = snapshot_io_mgr::instance();
    std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<nuraft::raft_server,void>
              ((__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
               &(pp->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    _Var15._M_pi = local_e8[1]._M_refcount._M_pi;
    local_c8._8_8_ = *(undefined8 *)last_log_idx;
    local_c8._16_8_ = *(long *)(last_log_idx + 8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_)->_M_use_count + 1;
      }
    }
    snapshot_io_mgr::push
              (this_02,&local_78,(ptr<peer> *)(local_c8 + 8),
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)&pp[(ulong)(*(element_type **)last_log_idx ==
                             pp[0x3a].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr) * 2 + 0x58].
                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._16_8_);
    }
    if (local_78.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    *in_stack_00000008 = 1;
    (_Var15._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
    (_Var15._M_pi)->_M_use_count = 0;
    (_Var15._M_pi)->_M_weak_count = 0;
    goto LAB_00226cbf;
  }
  local_139 = false;
  local_e8[0]._M_ptr = (element_type *)0x0;
  local_e8[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (*(char *)&((element_type *)((long)local_118._M_ptr + 0x28))->_vptr_rpc_listener == '\x01') {
    peer::get_snapshot_sync_ctx((peer *)local_138);
    pp_Var16 = (_func_int **)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_138._0_8_ + 0x18))->_M_allocated_capacity;
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    pp_Var3 = ((element_type *)((long)local_118._M_ptr + 0x10))->_vptr_rpc_listener;
    iVar9 = get_snapshot_sync_block_size((raft_server *)pp);
    size = 0;
    if (pp_Var16 <= pp_Var3) {
      size = (long)pp_Var3 - (long)pp_Var16;
    }
    if ((ulong)(long)iVar9 <= size) {
      size = (long)iVar9;
    }
    buffer::alloc((buffer *)local_138,size);
    uVar6 = local_138._8_8_;
    uVar5 = local_138._0_8_;
    local_138._0_8_ = (element_type *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    _Var15._M_pi = local_e8[0]._M_refcount._M_pi;
    local_e8[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    local_e8[0]._M_ptr = (element_type *)uVar5;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    peVar4 = pp[0x2f].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar10 = (*(code *)(peVar4->config_).
                       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                       endpoint_.field_2._M_allocated_capacity)
                       (peVar4,local_118._M_ptr,pp_Var16,local_e8[0]._M_ptr);
    sVar11 = buffer::size((buffer *)local_e8[0]._M_ptr);
    if ((ulong)(long)(int)uVar10 < sVar11) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
        if (1 < iVar8) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          sVar11 = buffer::size((buffer *)local_e8[0]._M_ptr);
          msg_if_given_abi_cxx11_
                    ((string *)local_138,
                     "only %d bytes could be read from snapshot while %zu bytes are expected, must be something wrong, exit."
                     ,(ulong)uVar10,sVar11);
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0xbc,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      pp_Var16 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
      (**(code **)(*pp_Var16 + 0x40))(pp_Var16,0xffffffee);
LAB_00226e8d:
      exit(-1);
    }
    sVar11 = buffer::size((buffer *)local_e8[0]._M_ptr);
    local_139 = ((element_type *)((long)local_118._M_ptr + 0x10))->_vptr_rpc_listener <=
                (_func_int **)(sVar11 + (long)pp_Var16);
LAB_00226b26:
    this_03 = (snapshot_sync_req *)operator_new(0x30);
    snapshot_sync_req::snapshot_sync_req
              (this_03,(ptr<snapshot> *)&local_118,(ulong)pp_Var16,(ptr<buffer> *)local_e8,local_139
              );
    _Var15._M_pi = local_e8[1]._M_refcount._M_pi;
    iVar9 = ((this_00->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_;
    local_58._16_8_ = *local_118._M_ptr;
    local_58.__data.__list.__prev =
         (__pthread_internal_list *)
         ((element_type *)((long)local_118._M_ptr + 8))->_vptr_rpc_listener;
    (local_e8[1]._M_refcount._M_pi)->_vptr__Sp_counted_base = 0;
    local_108._24_8_ = this_03;
    peVar12 = (element_type *)operator_new(0x60);
    (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_006204e0;
    uVar1 = *(undefined4 *)
             &pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (peVar12->bg_commit_thread_)._M_id._M_thread = local_c8._0_8_;
    *(undefined4 *)&(peVar12->bg_append_thread_)._M_id._M_thread = 0x10;
    *(undefined4 *)((long)&(peVar12->bg_append_thread_)._M_id._M_thread + 4) = uVar1;
    *(int32 *)&peVar12->bg_append_ea_ = iVar9;
    (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_00620530;
    *(undefined4 *)&peVar12->initialized_ = local_58._24_4_;
    (peVar12->leader_).super___atomic_base<int>._M_i = local_58._20_4_;
    peVar12->id_ = local_58.__data.__kind;
    peVar12->my_priority_ = local_58._20_4_;
    *(undefined8 *)&peVar12->target_priority_ = local_90;
    (peVar12->priority_change_timer_).t_created_ = (duration)0x0;
    (peVar12->priority_change_timer_).duration_us_ = 0;
    *(undefined8 *)&(peVar12->priority_change_timer_).first_event_fired_ = 0;
    (((enable_shared_from_this<nuraft::raft_server> *)((long)_Var15._M_pi + 8))->_M_weak_this).
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
    *(__weak_count<(__gnu_cxx::_Lock_policy)2> **)_Var15._M_pi =
         &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    snapshot_sync_req::serialize((snapshot_sync_req *)local_88);
    local_108[0x16] = '\x05';
    local_138._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),(log_entry **)local_138
               ,(allocator<nuraft::log_entry> *)(local_108 + 0x17),(unsigned_long *)local_c8,
               (shared_ptr<nuraft::buffer> *)local_88,local_108 + 0x16);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>::
    emplace_back<std::shared_ptr<nuraft::log_entry>>
              ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                *)&peVar12->priority_change_timer_,(shared_ptr<nuraft::log_entry> *)local_138);
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    *in_stack_00000008 = 1;
    if ((snapshot_sync_req *)local_108._24_8_ != (snapshot_sync_req *)0x0) {
      std::default_delete<nuraft::snapshot_sync_req>::operator()
                ((default_delete<nuraft::snapshot_sync_req> *)(local_108 + 0x18),
                 (snapshot_sync_req *)local_108._24_8_);
    }
  }
  else {
    peer::get_snapshot_sync_ctx((peer *)local_138);
    uVar6 = local_138._8_8_;
    uVar5 = local_138._0_8_;
    local_138._0_8_ = (element_type *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    this_01 = local_108._8_8_;
    local_108._8_8_ = uVar6;
    local_108._0_8_ = uVar5;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    pp_Var16 = (_func_int **)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_108._0_8_ + 0x18))->_M_allocated_capacity;
    puVar14 = (undefined8 *)(local_108._0_8_ + 0x20);
    p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
      if (4 < iVar8) {
        p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_138,"peer: %d, obj_idx: %lu, user_snp_ctx %p",
                   (ulong)(uint)((this_00->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_,pp_Var16,*puVar14);
        (*p_Var2->_vptr__Sp_counted_base[8])
                  (p_Var2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0xcc,local_138);
        if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
      }
    }
    peVar4 = pp[0x2f].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar10 = (**(code **)((long)&(peVar4->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr[1].endpoint_.field_2 + 8))
                       (peVar4,local_118._M_ptr,puVar14,pp_Var16,local_e8,&local_139);
    if ((int)uVar10 < 0) {
      p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar8 = (*p_Var2->_vptr__Sp_counted_base[7])();
        if (2 < iVar8) {
          p_Var2 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,
                     "reading snapshot (idx %lu, term %lu, object %lu) failed: %d",
                     (local_118._M_ptr)->_vptr_rpc_listener,
                     ((element_type *)((long)local_118._M_ptr + 8))->_vptr_rpc_listener,pp_Var16,
                     (ulong)uVar10);
          (*p_Var2->_vptr__Sp_counted_base[8])
                    (p_Var2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0xd6,local_138);
          if ((element_type *)local_138._0_8_ != (element_type *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      clear_snapshot_sync_ctx((raft_server *)pp,this_00);
      (local_e8[1]._M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
      (local_e8[1]._M_refcount._M_pi)->_M_use_count = 0;
      (local_e8[1]._M_refcount._M_pi)->_M_weak_count = 0;
      pp_Var16 = (_func_int **)0x0;
    }
    else if ((__pthread_internal_list *)local_e8[0]._M_ptr != (__pthread_internal_list *)0x0) {
      buffer::pos((buffer *)local_e8[0]._M_ptr,0);
    }
    _Var15._M_pi = local_e8[1]._M_refcount._M_pi;
    if (-1 < (int)uVar10) goto LAB_00226b26;
  }
  if (local_e8[0]._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8[0]._M_refcount._M_pi);
  }
LAB_00226cbf:
  if (local_118._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  _Var13._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var13._M_pi = extraout_RDX_00;
  }
  pVar19.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar19.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var15._M_pi;
  return (ptr<req_msg>)pVar19.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_sync_snapshot_req(ptr<peer>& pp,
                                                   ulong last_log_idx,
                                                   ulong term,
                                                   ulong commit_idx,
                                                   bool& succeeded_out) {
    succeeded_out = false;
    peer& p = *pp;
    ptr<raft_params> params = ctx_->get_params();
    std::unique_lock<std::mutex> guard(p.get_lock());
    ptr<snapshot_sync_ctx> sync_ctx = p.get_snapshot_sync_ctx();
    ptr<snapshot> snp = nullptr;
    ulong prev_sync_snp_log_idx = 0;
    if (sync_ctx) {
        snp = sync_ctx->get_snapshot();
        p_db( "previous sync_ctx exists %p, offset %" PRIu64 ", snp idx %" PRIu64
              ", user_ctx %p",
              sync_ctx.get(),
              sync_ctx->get_offset(),
              snp->get_last_log_idx(),
              sync_ctx->get_user_snp_ctx() );
        prev_sync_snp_log_idx = snp->get_last_log_idx();

        if (sync_ctx->get_timer().timeout()) {
            p_in("previous sync_ctx %p timed out, reset it", sync_ctx.get());
            destroy_user_snp_ctx(sync_ctx);
            sync_ctx.reset();
            snp.reset();
        }
    }

    // Modified by Jung-Sang Ahn, May 15 2018:
    //   Even though new snapshot has been created,
    //   keep using existing snapshot, as new snapshot will reset
    //   previous catching-up.
    //
    // if ( !snp /*||
    //      ( last_snapshot_ &&
    //        last_snapshot_->get_last_log_idx() > snp->get_last_log_idx() )*/ ) {
    if ( !snp || sync_ctx->get_offset() == 0 ) {
        snp = get_last_snapshot();
        if ( snp == nilptr ||
             last_log_idx > snp->get_last_log_idx() ) {
            // LCOV_EXCL_START
            p_er( "system is running into fatal errors, failed to find a "
                  "snapshot for peer %d (snapshot null: %d, snapshot "
                  "doesn't contais lastLogIndex: %d)",
                  p.get_id(), snp == nilptr ? 1 : 0,
                  last_log_idx > snp->get_last_log_idx() ? 1 : 0 );
            if (snp) {
                p_er("last log idx %" PRIu64 ", snp last log idx %" PRIu64,
                     last_log_idx, snp->get_last_log_idx());
            }
            ctx_->state_mgr_->system_exit(raft_err::N16_snapshot_for_peer_not_found);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }

        if ( snp->get_type() == snapshot::raw_binary &&
             snp->size() < 1L ) {
            // LCOV_EXCL_START
            p_er("invalid snapshot, this usually means a bug from state "
                 "machine implementation, stop the system to prevent "
                 "further errors");
            ctx_->state_mgr_->system_exit(raft_err::N17_empty_snapshot);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }

        if (snp->get_last_log_idx() != prev_sync_snp_log_idx) {
            p_in( "trying to sync snapshot with last index %" PRIu64 " to peer %d, "
                  "its last log idx %" PRIu64 "",
                  snp->get_last_log_idx(), p.get_id(), last_log_idx );
        }
        if (sync_ctx) {
            // If previous user context exists, should free it
            // as it causes memory leak.
            destroy_user_snp_ctx(sync_ctx);
        }

        // Timeout: heartbeat * response limit.
        ulong snp_timeout_ms = ctx_->get_params()->heart_beat_interval_ *
                               raft_server::raft_limits_.response_limit_;
        p.set_snapshot_in_sync(snp, snp_timeout_ms);
    }

    if (params->use_bg_thread_for_snapshot_io_) {
        // If async snapshot IO, push the snapshot read request to the manager
        // and immediately return here.
        snapshot_io_mgr::instance().push( this->shared_from_this(),
                                          pp,
                                          ( (pp == srv_to_join_)
                                            ? ex_resp_handler_
                                            : resp_handler_ ) );
        succeeded_out = true;
        return nullptr;
    }
    // Otherwise (sync snapshot IO), read the requested object here and then return.

    bool last_request = false;
    ptr<buffer> data = nullptr;
    ulong data_idx = 0;
    if (snp->get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary snapshot (original)
        ulong offset = p.get_snapshot_sync_ctx()->get_offset();
        ulong sz_left = ( snp->size() > offset ) ? ( snp->size() - offset ) : 0;
        int32 blk_sz = get_snapshot_sync_block_size();
        data = buffer::alloc((size_t)(std::min((ulong)blk_sz, sz_left)));
        int32 sz_rd = state_machine_->read_snapshot_data(*snp, offset, *data);
        if ((size_t)sz_rd < data->size()) {
            // LCOV_EXCL_START
            p_er( "only %d bytes could be read from snapshot while %zu "
                  "bytes are expected, must be something wrong, exit.",
                  sz_rd, data->size() );
            ctx_->state_mgr_->system_exit(raft_err::N18_partial_snapshot_block);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }
        last_request = (offset + (ulong)data->size()) >= snp->size();
        data_idx = offset;
        // LCOV_EXCL_STOP

    } else {
        // Logical object type snapshot
        sync_ctx = p.get_snapshot_sync_ctx();
        ulong obj_idx = sync_ctx->get_offset();
        void*& user_snp_ctx = sync_ctx->get_user_snp_ctx();
        p_dv("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
             (int)p.get_id(), obj_idx, user_snp_ctx);

        int rc = state_machine_->read_logical_snp_obj( *snp, user_snp_ctx, obj_idx,
                                                       data, last_request );
        if (rc < 0) {
            p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                  ", object %" PRIu64 ") failed: %d",
                  snp->get_last_log_idx(),
                  snp->get_last_log_term(),
                  obj_idx,
                  rc );
            // Reset the `sync_ctx` so as to retry with the newer version.
            clear_snapshot_sync_ctx(p);
            return nullptr;
        }
        if (data) data->pos(0);
        data_idx = obj_idx;
    }

    std::unique_ptr<snapshot_sync_req> sync_req
        ( new snapshot_sync_req(snp, data_idx, data, last_request) );
    ptr<req_msg> req( cs_new<req_msg>
                      ( term,
                        msg_type::install_snapshot_request,
                        id_,
                        p.get_id(),
                        snp->get_last_log_term(),
                        snp->get_last_log_idx(),
                        commit_idx ) );
    req->log_entries().push_back( cs_new<log_entry>
                                  ( term,
                                    sync_req->serialize(),
                                    log_val_type::snp_sync_req ) );

    succeeded_out = true;
    return req;
}